

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O2

void __thiscall
QSystemSemaphore::setNativeKey
          (QSystemSemaphore *this,QNativeIpcKey *key,int initialValue,AccessMode mode)

{
  _Head_base<0UL,_QSystemSemaphorePrivate_*,_false> _Var1;
  bool bVar2;
  long in_FS_OFFSET;
  QLatin1String local_70;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::comparesEqual(key,&((this->d)._M_t.
                                super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                                .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>.
                               _M_head_impl)->nativeKey);
  if ((mode != Open) || (!bVar2)) {
    bVar2 = isKeyTypeSupported((key->typeAndFlags).type);
    _Var1._M_head_impl =
         (this->d)._M_t.
         super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
         .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
    if (bVar2) {
      QSystemSemaphorePrivate::clearError(_Var1._M_head_impl);
      QSystemSemaphorePrivate::cleanHandle
                ((this->d)._M_t.
                 super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                 .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl);
      _Var1._M_head_impl =
           (this->d)._M_t.
           super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
           .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
      if ((key->typeAndFlags).type ==
          ((TypeAndFlags *)((long)&(_Var1._M_head_impl)->nativeKey + 0x20))->type) {
        QNativeIpcKey::operator=(&(_Var1._M_head_impl)->nativeKey,key);
      }
      else {
        QSystemSemaphorePrivate::destructBackend(_Var1._M_head_impl);
        QNativeIpcKey::operator=
                  (&((this->d)._M_t.
                     super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                     .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl)->
                    nativeKey,key);
        _Var1._M_head_impl =
             (this->d)._M_t.
             super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
             .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
        if (((TypeAndFlags *)((long)&(_Var1._M_head_impl)->nativeKey + 0x20))->type == PosixRealtime
           ) {
          *(undefined8 *)&((_Var1._M_head_impl)->backend).d = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 8) = 0;
        }
        else {
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x10) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x18) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x20) = 0;
          *(undefined8 *)&((_Var1._M_head_impl)->backend).d = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 8) = 0;
          *(undefined8 *)((long)&(_Var1._M_head_impl)->backend + 0x18) = 0xffffffffffffffff;
        }
      }
      _Var1._M_head_impl =
           (this->d)._M_t.
           super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
           .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
      (_Var1._M_head_impl)->initialValue = initialValue;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QSystemSemaphorePrivate::handle(_Var1._M_head_impl,mode);
        return;
      }
      goto LAB_0020a037;
    }
    tr((QString *)&local_60,"%1: unsupported key type",(char *)0x0,-1);
    local_70.m_size = 0x1e;
    local_70.m_data = "QSystemSemaphore::setNativeKey";
    QString::arg<QLatin1String,_true>
              ((QString *)&local_48,(QString *)&local_60,&local_70,0,(QChar)0x20);
    (_Var1._M_head_impl)->error = KeyError;
    QString::operator=(&(_Var1._M_head_impl)->errorString,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0020a037:
  __stack_chk_fail();
}

Assistant:

void QSystemSemaphore::setNativeKey(const QNativeIpcKey &key, int initialValue, AccessMode mode)
{
    if (key == d->nativeKey && mode == Open)
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSystemSemaphore::setNativeKey"_L1));
        return;
    }

    d->clearError();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
    d->initialValue = initialValue;
    d->handle(mode);
}